

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FStateDefine,_FStateDefine>::DoCopy
          (TArray<FStateDefine,_FStateDefine> *this,TArray<FStateDefine,_FStateDefine> *other)

{
  uint uVar1;
  FStateDefine *pFVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FStateDefine *)0x0;
  }
  else {
    pFVar2 = (FStateDefine *)
             M_Malloc_Dbg((ulong)uVar1 * 0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar2;
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < this->Count; uVar3 = uVar3 + 1) {
      FStateDefine::FStateDefine
                ((FStateDefine *)((long)&(this->Array->Label).Index + lVar4),
                 (FStateDefine *)((long)&(other->Array->Label).Index + lVar4));
      lVar4 = lVar4 + 0x28;
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}